

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void acttab_action(acttab *p,int lookahead,int action)

{
  int iVar1;
  int iVar2;
  lookahead_action *plVar3;
  
  iVar2 = p->nLookahead;
  iVar1 = p->nLookaheadAlloc;
  if (iVar1 <= iVar2) {
    p->nLookaheadAlloc = iVar1 + 0x19;
    plVar3 = (lookahead_action *)realloc(p->aLookahead,(long)iVar1 * 8 + 200);
    p->aLookahead = plVar3;
    if (plVar3 == (lookahead_action *)0x0) {
      fwrite("malloc failed\n",0xe,1,_stderr);
      exit(1);
    }
    iVar2 = p->nLookahead;
  }
  if (iVar2 == 0) {
    p->mxLookahead = lookahead;
  }
  else {
    if (p->mxLookahead < lookahead) {
      p->mxLookahead = lookahead;
    }
    if (p->mnLookahead <= lookahead) goto LAB_00103503;
  }
  p->mnLookahead = lookahead;
  p->mnAction = action;
LAB_00103503:
  plVar3 = p->aLookahead;
  plVar3[iVar2].lookahead = lookahead;
  plVar3[iVar2].action = action;
  p->nLookahead = iVar2 + 1;
  return;
}

Assistant:

void acttab_action(acttab *p, int lookahead, int action){
  if( p->nLookahead>=p->nLookaheadAlloc ){
    p->nLookaheadAlloc += 25;
    p->aLookahead = (struct lookahead_action *) realloc( p->aLookahead,
                             sizeof(p->aLookahead[0])*p->nLookaheadAlloc );
    if( p->aLookahead==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
  }
  if( p->nLookahead==0 ){
    p->mxLookahead = lookahead;
    p->mnLookahead = lookahead;
    p->mnAction = action;
  }else{
    if( p->mxLookahead<lookahead ) p->mxLookahead = lookahead;
    if( p->mnLookahead>lookahead ){
      p->mnLookahead = lookahead;
      p->mnAction = action;
    }
  }
  p->aLookahead[p->nLookahead].lookahead = lookahead;
  p->aLookahead[p->nLookahead].action = action;
  p->nLookahead++;
}